

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_symbol.cpp
# Opt level: O2

int DSDcc::DSDSymbol::invert_dibit(int dibit)

{
  if ((uint)dibit < 4) {
    return *(int *)(&DAT_00124c80 + (ulong)(uint)dibit * 4);
  }
  return -1;
}

Assistant:

int DSDSymbol::invert_dibit(int dibit)
{
    switch (dibit)
    {
    case 0:
        return 2;
    case 1:
        return 3;
    case 2:
        return 0;
    case 3:
        return 1;
    }

    // Error, shouldn't be here
    assert(0);
    return -1;
}